

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawElementsBaseVertexTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::BuiltInVariableGroup::init
          (BuiltInVariableGroup *this,EVP_PKEY_CTX *ctx)

{
  DrawMethod DVar1;
  Context *pCVar2;
  int iVar3;
  int extraout_EAX;
  TestNode *node;
  undefined4 extraout_var;
  
  node = (TestNode *)operator_new(0x98);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  DVar1 = this->m_method;
  tcu::TestCase::TestCase((TestCase *)node,pCVar2->m_testCtx,"vertex_id","gl_VertexID Test");
  node[1]._vptr_TestNode = (_func_int **)pCVar2;
  node->_vptr_TestNode = (_func_int **)&PTR__VertexIDCase_021ad6c0;
  iVar3 = (*pCVar2->m_renderCtx->_vptr_RenderContext[3])();
  node[1].m_testCtx = (TestContext *)CONCAT44(extraout_var,iVar3);
  node[1].m_name._M_dataplus._M_p = (pointer)0x0;
  node[1].m_name._M_string_length = 0;
  *(undefined4 *)&node[1].m_name.field_2 = 0;
  *(DrawMethod *)((long)&node[1].m_name.field_2 + 4) = DVar1;
  tcu::TestNode::addChild((TestNode *)this,node);
  return extraout_EAX;
}

Assistant:

void BuiltInVariableGroup::init (void)
{
	addChild(new VertexIDCase(m_context, m_method));
}